

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTypePtr
xmlSchemaParseSimpleType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  xmlChar **uri;
  uint uVar1;
  xmlSchemaTypePtr pxVar2;
  _xmlAttr *p_Var3;
  bool bVar4;
  long lVar5;
  int iVar6;
  xmlAttrPtr pxVar7;
  xmlSchemaTypePtr pxVar8;
  xmlSchemaAnnotPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlNodePtr pxVar11;
  byte *cur;
  ulong uVar12;
  xmlSchemaTypeLinkPtr pxVar13;
  xmlSchemaTypePtr pxVar14;
  _xmlNode *p_Var15;
  xmlSchemaTypePtr *ppxVar16;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar17;
  _xmlSchemaType **pp_Var18;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlSchemaBasicItemPtr extraout_RDX_10;
  xmlSchemaBasicItemPtr extraout_RDX_11;
  xmlSchemaBasicItemPtr extraout_RDX_12;
  xmlSchemaBasicItemPtr extraout_RDX_13;
  xmlSchemaBasicItemPtr extraout_RDX_14;
  xmlSchemaBasicItemPtr pxVar19;
  xmlSchemaBasicItemPtr extraout_RDX_15;
  xmlSchemaBasicItemPtr extraout_RDX_16;
  xmlSchemaBasicItemPtr extraout_RDX_17;
  xmlParserErrors error;
  xmlChar **in_R8;
  char *in_R9;
  _xmlAttr **pp_Var20;
  long lVar21;
  ulong in_stack_ffffffffffffff48;
  undefined4 uVar22;
  xmlChar **local;
  undefined8 in_stack_ffffffffffffff50;
  xmlChar *in_stack_ffffffffffffff58;
  xmlNodePtr ownerItem;
  int *flags;
  xmlSchemaTypeLinkPtr local_70;
  xmlChar *attrValue;
  xmlSchemaTypePtr local_58;
  xmlSchemaTypeLinkPtr local_50;
  xmlSchemaTypeLinkPtr local_48;
  xmlChar *local_40;
  xmlChar *localName;
  
  uVar22 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
  pxVar17 = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  attrValue = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTypePtr)0x0;
  }
  if (topLevel == 0) {
    local = (xmlChar **)(in_stack_ffffffffffffff48 & 0xffffffff00000000);
    pxVar7 = (xmlAttrPtr)0x0;
    pxVar8 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar8 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar8->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar8->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    pp_Var20 = &node->properties;
    pxVar19 = extraout_RDX;
    while (p_Var3 = *pp_Var20, p_Var3 != (_xmlAttr *)0x0) {
      if (p_Var3->ns == (xmlNs *)0x0) {
        iVar6 = xmlStrEqual(p_Var3->name,"id");
        pxVar19 = extraout_RDX_02;
        if (iVar6 == 0) goto LAB_0018c829;
      }
      else {
        iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar19 = extraout_RDX_00;
        if (iVar6 != 0) {
LAB_0018c829:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar19,pxVar7);
          pxVar19 = extraout_RDX_01;
        }
      }
      pp_Var20 = &p_Var3->next;
    }
  }
  else {
    pxVar7 = xmlSchemaGetPropNode(node,"name");
    if (pxVar7 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1bc044,pxVar17,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar8 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar6 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar7,(xmlAttrPtr)pxVar8,
                       (xmlSchemaTypePtr)&attrValue,in_R8);
    if (iVar6 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (ctxt->isS4S != 0) {
      if (ctxt->isRedefine != 0) {
        xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                            "Redefinition of built-in simple types is not supported",(xmlChar *)0x0)
        ;
        return (xmlSchemaTypePtr)0x0;
      }
      pxVar8 = xmlSchemaGetPredefinedType(attrValue,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (pxVar8 != (xmlSchemaTypePtr)0x0) {
        return pxVar8;
      }
    }
    local = (xmlChar **)CONCAT44(uVar22,1);
    pxVar7 = (xmlAttrPtr)attrValue;
    pxVar8 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,attrValue,ctxt->targetNamespace,
                              node,1);
    if (pxVar8 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar8->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar8->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    flags = &pxVar8->flags;
    *(byte *)&pxVar8->flags = (byte)pxVar8->flags | 8;
    pp_Var20 = &node->properties;
    while( true ) {
      iVar6 = (int)in_stack_ffffffffffffff50;
      p_Var3 = *pp_Var20;
      if (p_Var3 == (_xmlAttr *)0x0) break;
      if (p_Var3->ns == (xmlNs *)0x0) {
        iVar6 = xmlStrEqual(p_Var3->name,"id");
        if (((iVar6 == 0) && (iVar6 = xmlStrEqual(p_Var3->name,"name"), iVar6 == 0)) &&
           (iVar6 = xmlStrEqual(p_Var3->name,(xmlChar *)"final"), pxVar19 = extraout_RDX_09,
           iVar6 == 0)) goto LAB_0018cb3b;
      }
      else {
        iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar19 = extraout_RDX_08;
        if (iVar6 != 0) {
LAB_0018cb3b:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar19,pxVar7);
        }
      }
      pp_Var20 = &p_Var3->next;
    }
    pxVar7 = xmlSchemaGetPropNode(node,"final");
    if (pxVar7 == (xmlAttrPtr)0x0) {
      uVar1 = schema->flags;
      if ((uVar1 & 8) != 0) {
        *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 4;
      }
      if ((uVar1 & 0x10) != 0) {
        *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 8;
      }
      pxVar19 = extraout_RDX_10;
      if ((uVar1 & 0x20) != 0) {
        *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x10;
      }
    }
    else {
      attrValue = xmlSchemaGetProp(ctxt,node,"final");
      local = (xmlChar **)CONCAT44((int)((ulong)local >> 0x20),0x1000);
      iVar6 = xmlSchemaPValAttrBlockFinal(attrValue,flags,-1,0x400,-1,0x800,0x1000,iVar6);
      pxVar19 = extraout_RDX_11;
      if (iVar6 != 0) {
        local = (xmlChar **)0x0;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar7,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(#all | List of (list | union | restriction)",
                   (char *)attrValue,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff58,
                   (xmlChar *)flags);
        pxVar19 = extraout_RDX_12;
      }
    }
  }
  pxVar8->targetNamespace = ctxt->targetNamespace;
  xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar19);
  pxVar2 = ctxt->ctxtType;
  ctxt->ctxtType = pxVar8;
  pxVar17 = node->children;
  if (pxVar17 == (xmlNodePtr)0x0) {
LAB_0018c915:
    bVar4 = false;
    error = XML_SCHEMAP_S4S_ELEM_MISSING;
    pxVar17 = (xmlNodePtr)0x0;
  }
  else {
    if (((pxVar17->ns != (xmlNs *)0x0) &&
        (iVar6 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
       (iVar6 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 != 0)) {
      pxVar9 = xmlSchemaParseAnnotation(ctxt,pxVar17,1);
      pxVar8->annot = pxVar9;
      pxVar17 = pxVar17->next;
      if (pxVar17 == (_xmlNode *)0x0) goto LAB_0018c915;
    }
    if (pxVar17->ns == (xmlNs *)0x0) {
      bVar4 = false;
    }
    else {
      iVar6 = xmlStrEqual(pxVar17->name,(xmlChar *)"restriction");
      if ((iVar6 == 0) ||
         (iVar6 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) {
        if (pxVar17->ns == (xmlNs *)0x0) {
LAB_0018ce16:
          bVar4 = false;
          goto LAB_0018d25e;
        }
        pxVar11 = pxVar17;
        iVar6 = xmlStrEqual(pxVar17->name,"list");
        ownerItem = pxVar17;
        if ((iVar6 == 0) ||
           (iVar6 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if ((pxVar17->ns == (xmlNs *)0x0) ||
             ((pxVar11 = pxVar17, iVar6 = xmlStrEqual(pxVar17->name,"union"), iVar6 == 0 ||
              (iVar6 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar6 == 0)))) goto LAB_0018ce16;
          pxVar14 = ctxt->ctxtType;
          pxVar14->flags = pxVar14->flags | 0x80;
          pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
          pxVar14->baseType = pxVar10;
          pp_Var20 = &pxVar17->properties;
          pxVar19 = extraout_RDX_13;
          local_58 = pxVar14;
          while (p_Var3 = *pp_Var20, p_Var3 != (_xmlAttr *)0x0) {
            if (p_Var3->ns == (xmlNs *)0x0) {
              iVar6 = xmlStrEqual(p_Var3->name,"id");
              pxVar19 = extraout_RDX_16;
              pxVar17 = ownerItem;
              if ((iVar6 == 0) &&
                 (iVar6 = xmlStrEqual(p_Var3->name,(xmlChar *)"memberTypes"),
                 pxVar19 = extraout_RDX_17, pxVar17 = ownerItem, iVar6 == 0)) goto LAB_0018ccd1;
            }
            else {
              iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar19 = extraout_RDX_14;
              pxVar17 = ownerItem;
              if (iVar6 != 0) {
LAB_0018ccd1:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar19,(xmlAttrPtr)pxVar11);
                pxVar19 = extraout_RDX_15;
                pxVar17 = ownerItem;
              }
            }
            ownerItem = pxVar17;
            pp_Var20 = &p_Var3->next;
          }
          xmlSchemaPValAttrID(ctxt,pxVar17,(xmlChar *)pxVar19);
          pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar17,"memberTypes");
          if (pxVar11 != (xmlNodePtr)0x0) {
            cur = xmlSchemaGetNodeContent(ctxt,pxVar11);
            pxVar17 = ownerItem;
            if (cur != (byte *)0x0) {
              local_58->base = cur;
              local_48 = (xmlSchemaTypeLinkPtr)&local_58->memberTypes;
              local_70 = (xmlSchemaTypeLinkPtr)0x0;
              do {
                while ((uVar12 = (ulong)*cur, uVar12 < 0x21 &&
                       ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0))) {
                  cur = cur + 1;
                }
                lVar21 = 0;
                while ((0x20 < (byte)uVar12 || ((0x100002601U >> (uVar12 & 0x3f) & 1) == 0))) {
                  lVar5 = lVar21 + 1;
                  lVar21 = lVar21 + 1;
                  uVar12 = (ulong)cur[lVar5];
                }
                if (lVar21 == 0) break;
                pxVar7 = (xmlAttrPtr)xmlStrndup(cur,(int)lVar21);
                if (pxVar7 == (xmlAttrPtr)0x0) {
                  xmlSchemaPErrMemory(ctxt);
                  pxVar17 = ownerItem;
                  goto LAB_0018d3db;
                }
                iVar6 = xmlSchemaPValAttrNodeQNameValue
                                  (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar11,pxVar7,
                                   (xmlChar *)&local_40,&localName,local);
                if (iVar6 == 0) {
                  pxVar13 = (xmlSchemaTypeLinkPtr)(*xmlMalloc)(0x10);
                  if (pxVar13 == (xmlSchemaTypeLinkPtr)0x0) {
                    xmlSchemaPErrMemory(ctxt);
                    (*xmlFree)(pxVar7);
                    pxVar17 = ownerItem;
                    goto LAB_0018d3db;
                  }
                  pxVar13->next = (_xmlSchemaTypeLink *)0x0;
                  pxVar13->type = (xmlSchemaTypePtr)0x0;
                  local_50 = pxVar13;
                  pxVar14 = (xmlSchemaTypePtr)
                            xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_SIMPLE,localName,local_40);
                  if (pxVar14 == (xmlSchemaTypePtr)0x0) {
                    xmlSchemaPErrMemory(ctxt);
                    (*xmlFree)(local_50);
                    (*xmlFree)(pxVar7);
                    pxVar17 = ownerItem;
                    goto LAB_0018d3db;
                  }
                  local_50->type = pxVar14;
                  if (local_70 == (xmlSchemaTypeLinkPtr)0x0) {
                    local_70 = local_48;
                  }
                  local_70->next = local_50;
                  local_70 = local_50;
                }
                cur = cur + lVar21;
                (*xmlFree)(pxVar7);
              } while (*cur != 0);
              goto LAB_0018cf93;
            }
LAB_0018d3db:
            bVar4 = false;
            goto LAB_0018d255;
          }
LAB_0018cf93:
          p_Var15 = ownerItem->children;
          pxVar17 = ownerItem;
          if (p_Var15 != (xmlNodePtr)0x0) {
            if (((p_Var15->ns != (xmlNs *)0x0) &&
                (iVar6 = xmlStrEqual(p_Var15->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
               (iVar6 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 != 0)) {
              pxVar9 = xmlSchemaParseAnnotation(ctxt,p_Var15,1);
              xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)local_58,pxVar9);
              p_Var15 = p_Var15->next;
              pxVar17 = ownerItem;
              if (p_Var15 == (xmlNodePtr)0x0) goto LAB_0018d341;
            }
            if (((p_Var15->ns == (xmlNs *)0x0) ||
                (iVar6 = xmlStrEqual(p_Var15->name,"simpleType"), iVar6 == 0)) ||
               (iVar6 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 == 0)) {
LAB_0018d31f:
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)ownerItem,
                         p_Var15,(xmlNodePtr)0x0,"(annotation?, simpleType*)",(char *)local);
              pxVar17 = ownerItem;
            }
            else {
              ppxVar16 = &local_58->subtypes;
              pxVar14 = (xmlSchemaTypePtr)0x0;
              for (; pxVar17 = ownerItem, p_Var15 != (xmlNodePtr)0x0; p_Var15 = p_Var15->next) {
                if (((p_Var15->ns == (xmlNs *)0x0) ||
                    (iVar6 = xmlStrEqual(p_Var15->name,"simpleType"), iVar6 == 0)) ||
                   (iVar6 = xmlStrEqual(p_Var15->ns->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                goto LAB_0018d31f;
                pxVar10 = xmlSchemaParseSimpleType(ctxt,schema,p_Var15,0);
                if (pxVar10 != (xmlSchemaTypePtr)0x0) {
                  pp_Var18 = &pxVar14->next;
                  if (pxVar14 == (xmlSchemaTypePtr)0x0) {
                    pp_Var18 = ppxVar16;
                  }
                  *pp_Var18 = pxVar10;
                  pxVar10->next = (_xmlSchemaType *)0x0;
                  pxVar14 = pxVar10;
                }
              }
            }
          }
LAB_0018d341:
          if (pxVar11 != (xmlNodePtr)0x0) {
            bVar4 = false;
            goto LAB_0018d255;
          }
          if (local_58->subtypes == (xmlSchemaTypePtr)0x0) {
            xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_UNION_MEMBERTYPES_OR_SIMPLETYPES,
                                (xmlSchemaBasicItemPtr)0x0,pxVar17,
                                "Either the attribute \'memberTypes\' or at least one <simpleType> child must be present"
                                ,(xmlChar *)0x0);
            goto LAB_0018d3db;
          }
        }
        else {
          pxVar14 = ctxt->ctxtType;
          pxVar14->flags = pxVar14->flags | 0x40;
          pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
          pxVar14->baseType = pxVar10;
          pp_Var20 = &pxVar17->properties;
          pxVar19 = extraout_RDX_03;
          while (p_Var3 = *pp_Var20, p_Var3 != (_xmlAttr *)0x0) {
            if (p_Var3->ns == (xmlNs *)0x0) {
              iVar6 = xmlStrEqual(p_Var3->name,"id");
              pxVar19 = extraout_RDX_06;
              pxVar17 = ownerItem;
              if ((iVar6 == 0) &&
                 (iVar6 = xmlStrEqual(p_Var3->name,(xmlChar *)"itemType"), pxVar19 = extraout_RDX_07
                 , pxVar17 = ownerItem, iVar6 == 0)) goto LAB_0018ca57;
            }
            else {
              iVar6 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar19 = extraout_RDX_04;
              pxVar17 = ownerItem;
              if (iVar6 != 0) {
LAB_0018ca57:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar19,(xmlAttrPtr)pxVar11);
                pxVar19 = extraout_RDX_05;
                pxVar17 = ownerItem;
              }
            }
            ownerItem = pxVar17;
            pp_Var20 = &p_Var3->next;
          }
          xmlSchemaPValAttrID(ctxt,pxVar17,(xmlChar *)pxVar19);
          uri = &pxVar14->base;
          xmlSchemaPValAttrQName
                    (ctxt,schema,(xmlSchemaBasicItemPtr)ownerItem,(xmlNodePtr)"itemType",
                     (char *)&pxVar14->baseNs,uri,local);
          p_Var15 = ownerItem->children;
          pxVar17 = ownerItem;
          if (p_Var15 == (xmlNodePtr)0x0) {
            p_Var15 = (xmlNodePtr)0x0;
LAB_0018d0b9:
            if (*uri == (xmlChar *)0x0) {
              xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,
                                  pxVar17,
                                  "Either the attribute \'itemType\' or the <simpleType> child must be present"
                                  ,(xmlChar *)0x0);
            }
          }
          else {
            if (((p_Var15->ns != (xmlNs *)0x0) &&
                (iVar6 = xmlStrEqual(p_Var15->name,(xmlChar *)"annotation"), pxVar17 = ownerItem,
                iVar6 != 0)) &&
               (iVar6 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , pxVar17 = ownerItem, iVar6 != 0)) {
              pxVar9 = xmlSchemaParseAnnotation(ctxt,p_Var15,1);
              xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar14,pxVar9);
              p_Var15 = p_Var15->next;
              pxVar17 = ownerItem;
              if (p_Var15 == (_xmlNode *)0x0) {
                p_Var15 = (xmlNodePtr)0x0;
                goto LAB_0018d0b9;
              }
            }
            if (((p_Var15->ns == (xmlNs *)0x0) ||
                (iVar6 = xmlStrEqual(p_Var15->name,"simpleType"), iVar6 == 0)) ||
               (iVar6 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 == 0)) goto LAB_0018d0b9;
            if (*uri == (xmlChar *)0x0) {
              pxVar10 = xmlSchemaParseSimpleType(ctxt,schema,p_Var15,0);
              pxVar14->subtypes = pxVar10;
            }
            else {
              xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,
                                  pxVar17,
                                  "The attribute \'itemType\' and the <simpleType> child are mutually exclusive"
                                  ,(xmlChar *)0x0);
            }
            p_Var15 = p_Var15->next;
          }
          if (p_Var15 != (xmlNodePtr)0x0) {
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar17,p_Var15,
                       (xmlNodePtr)0x0,"(annotation?, simpleType?)",(char *)local);
          }
          if ((*uri == (xmlChar *)0x0) && (pxVar14->subtypes == (xmlSchemaTypePtr)0x0)) {
            pxVar7 = xmlSchemaGetPropNode(pxVar17,"itemType");
            if (pxVar7 == (xmlAttrPtr)0x0) {
              bVar4 = false;
              xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,
                                  pxVar17,
                                  "Either the attribute \'itemType\' or the <simpleType> child must be present"
                                  ,(xmlChar *)0x0);
            }
            else {
              bVar4 = false;
            }
            goto LAB_0018d255;
          }
        }
        bVar4 = false;
      }
      else {
        xmlSchemaParseRestriction(ctxt,schema,pxVar17,XML_SCHEMA_TYPE_SIMPLE);
        bVar4 = true;
      }
LAB_0018d255:
      pxVar17 = pxVar17->next;
      if (pxVar17 == (xmlNodePtr)0x0) goto LAB_0018d278;
    }
LAB_0018d25e:
    error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
  }
  xmlSchemaPContentErr
            (ctxt,error,(xmlSchemaBasicItemPtr)node,pxVar17,(xmlNodePtr)0x0,
             "(annotation?, (restriction | list | union))",(char *)local);
LAB_0018d278:
  if ((topLevel != 0) && (!bVar4 && ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                        "This is a redefinition, thus the <simpleType> must have a <restriction> child"
                        ,(xmlChar *)0x0);
  }
  ctxt->ctxtType = pxVar2;
  return pxVar8;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseSimpleType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                         xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, oldCtxtType;
    xmlNodePtr child = NULL;
    const xmlChar *attrValue = NULL;
    xmlAttrPtr attr;
    int hasRestriction = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node,
		"name", NULL);
	    return (NULL);
	} else {
	    if (xmlSchemaPValAttrNode(ctxt,
		NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &attrValue) != 0)
		return (NULL);
	    /*
	    * Skip built-in types.
	    */
	    if (ctxt->isS4S) {
		xmlSchemaTypePtr biType;

		if (ctxt->isRedefine) {
		    /*
		    * REDEFINE: Disallow redefinition of built-in-types.
		    * TODO: It seems that the spec does not say anything
		    * about this case.
		    */
		    xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
			NULL, node,
			"Redefinition of built-in simple types is not "
			"supported", NULL);
		    return(NULL);
		}
		biType = xmlSchemaGetPredefinedType(attrValue, xmlSchemaNs);
		if (biType != NULL)
		    return (biType);
	    }
	}
    }
    /*
    * TargetNamespace:
    * SPEC "The `actual value` of the targetNamespace [attribute]
    * of the <schema> ancestor element information item if present,
    * otherwise `absent`.
    */
    if (topLevel == 0) {
#ifdef ENABLE_NAMED_LOCALS
        char buf[40];
#endif
	/*
	* Parse as local simple type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#ST%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Parse as global simple type definition.
	*
	* Note that attrValue is the value of the attribute "name" here.
	*/
	type = xmlSchemaAddType(ctxt, schema, XML_SCHEMA_TYPE_SIMPLE,
	    attrValue, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "final"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Attribute "final".
	*/
	attr = xmlSchemaGetPropNode(node, "final");
	if (attr == NULL) {
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_LIST)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_LIST;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_UNION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_UNION;
	} else {
	    attrValue = xmlSchemaGetProp(ctxt, node, "final");
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
		-1, -1, XML_SCHEMAS_TYPE_FINAL_RESTRICTION, -1,
		XML_SCHEMAS_TYPE_FINAL_LIST,
		XML_SCHEMAS_TYPE_FINAL_UNION) != 0) {

		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    WXS_BASIC_CAST type, (xmlNodePtr) attr,
		    NULL, "(#all | List of (list | union | restriction)",
		    attrValue, NULL, NULL, NULL);
	    }
	}
    }
    type->targetNamespace = ctxt->targetNamespace;
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    oldCtxtType = ctxt->ctxtType;

    ctxt->ctxtType = type;

    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    } else if (IS_SCHEMA(child, "restriction")) {
        xmlSchemaParseRestriction(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE);
	hasRestriction = 1;
        child = child->next;
    } else if (IS_SCHEMA(child, "list")) {
        xmlSchemaParseList(ctxt, schema, child);
        child = child->next;
    } else if (IS_SCHEMA(child, "union")) {
        xmlSchemaParseUnion(ctxt, schema, child);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    * "Within the [children], each <simpleType> must have a
    * <restriction> among its [children] ... the `actual value` of whose
    * base [attribute] must be the same as the `actual value` of its own
    * name attribute plus target namespace;"
    */
    if (topLevel && ctxt->isRedefine && (! hasRestriction)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<simpleType> must have a <restriction> child", NULL);
    }

    ctxt->ctxtType = oldCtxtType;
    return (type);
}